

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  string *configPath;
  InputParser parser;
  Config config;
  int local_164;
  string local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  Config local_128;
  
  local_164 = argc;
  InputParser::InputParser((InputParser *)&local_140,&local_164,argv);
  local_128.rootDir._M_dataplus._M_p = (pointer)&local_128.rootDir.field_2;
  local_128.rootDir._M_string_length = 0;
  local_128.rootDir.field_2._M_local_buf[0] = '\0';
  local_128.templateDir._M_dataplus._M_p = (pointer)&local_128.templateDir.field_2;
  local_128.templateDir._M_string_length = 0;
  local_128.templateDir.field_2._M_local_buf[0] = '\0';
  local_128.port = 0x1f90;
  local_128.https = false;
  local_128.crt._M_dataplus._M_p = (pointer)&local_128.crt.field_2;
  local_128.crt._M_string_length = 0;
  local_128.crt.field_2._M_local_buf[0] = '\0';
  local_128.key._M_dataplus._M_p = (pointer)&local_128.key.field_2;
  local_128.key._M_string_length = 0;
  local_128.key.field_2._M_local_buf[0] = '\0';
  local_128.reload = false;
  local_128.email.url._M_dataplus._M_p = (pointer)&local_128.email.url.field_2;
  local_128.email.url._M_string_length = 0;
  local_128.email.url.field_2._M_local_buf[0] = '\0';
  local_128.email.apiKey._M_dataplus._M_p = (pointer)&local_128.email.apiKey.field_2;
  local_128.email.apiKey._M_string_length = 0;
  local_128.email.apiKey.field_2._M_local_buf[0] = '\0';
  local_128.email.toEmail._M_dataplus._M_p = (pointer)&local_128.email.toEmail.field_2;
  local_128.email.toEmail._M_string_length = 0;
  local_128.email.toEmail.field_2._M_local_buf[0] = '\0';
  local_128.email.toName._M_dataplus._M_p = (pointer)&local_128.email.toName.field_2;
  local_128.email.toName._M_string_length = 0;
  local_128.email.toName.field_2._M_local_buf[0] = '\0';
  local_128.template_._M_t.
  super___uniq_ptr_impl<EasyWeb::WebFile,_std::default_delete<EasyWeb::WebFile>_>._M_t.
  super__Tuple_impl<0UL,_EasyWeb::WebFile_*,_std::default_delete<EasyWeb::WebFile>_>.
  super__Head_base<0UL,_EasyWeb::WebFile_*,_false>._M_head_impl =
       (__uniq_ptr_data<EasyWeb::WebFile,_std::default_delete<EasyWeb::WebFile>,_true,_true>)
       (__uniq_ptr_impl<EasyWeb::WebFile,_std::default_delete<EasyWeb::WebFile>_>)0x0;
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"-config","");
  configPath = InputParser::getCmdOption((InputParser *)&local_140,&local_160);
  Angelsen::Config::updateFromJson(&local_128,configPath);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  Angelsen::Config::loadTemplate(&local_128);
  Angelsen::runServer(&local_128);
  Angelsen::Config::~Config(&local_128);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_140);
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
    InputParser parser(argc, argv);

    Angelsen::Config config;
    config.updateFromJson(parser.getCmdOption("-config"));
    config.loadTemplate();

    Angelsen::runServer(config);
}